

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>_&>
                  *this,btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>
                        *container,MatchResultListener *listener)

{
  pointer pMVar1;
  ostream *poVar2;
  pointer pbVar3;
  bool bVar4;
  MatchResultListener *pMVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  const_iterator cVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_220;
  ostream *local_210;
  btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>
  *local_208;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_200;
  long local_1f0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_210 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  cVar11 = phmap::priv::
           btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
           ::begin((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                    *)container);
  local_220.node = cVar11.node;
  local_220.position = cVar11.position;
  cVar11 = phmap::priv::
           btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
           ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                  *)container);
  if (local_220.position == cVar11.position && local_220.node == cVar11.node) {
    sVar10 = 0;
    bVar6 = false;
  }
  else {
    lVar8 = 0;
    lVar7 = 0;
    sVar10 = 0;
    local_208 = container;
    do {
      bVar6 = false;
      pMVar1 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar10 == ((long)(this->matchers_).
                           super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) *
                    -0x5555555555555555) break;
      if (local_210 == (ostream *)0x0) {
        if (((ulong)local_220.node & 7) != 0) goto LAB_001cf78e;
        local_1c8._8_8_ = (ostream *)0x0;
        local_1c8._0_8_ = &PTR__MatchResultListener_004790b8;
        bVar4 = MatcherBase<const_int_&>::MatchAndExplain
                          ((MatcherBase<const_int_&> *)
                           ((long)&(pMVar1->super_MatcherBase<const_int_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar7),(int *)(local_220.node + (long)local_220.position * 4 + 0xc),
                           (MatchResultListener *)local_1c8);
      }
      else {
        local_1c8._8_8_ = local_1a8;
        local_1c8._0_8_ = &PTR__StringMatchResultListener_004791e0;
        std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
        if (((ulong)local_220.node & 7) != 0) goto LAB_001cf78e;
        bVar4 = MatcherBase<const_int_&>::MatchAndExplain
                          ((MatcherBase<const_int_&> *)
                           ((long)&(((this->matchers_).
                                     super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_MatcherBase<const_int_&>).super_MatcherDescriberInterface.
                                   _vptr_MatcherDescriberInterface + lVar7),
                           (int *)(local_220.node + (long)local_220.position * 4 + 0xc),
                           (MatchResultListener *)local_1c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_1e0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                   (string *)&local_200);
        if (local_200.node !=
            (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
             *)local_1f0) {
          operator_delete(local_200.node,local_1f0[0] + 1);
        }
        local_1c8._0_8_ = &PTR__StringMatchResultListener_004791e0;
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      bVar6 = false;
      if (bVar4 == false) {
        bVar6 = true;
        container = local_208;
        break;
      }
      phmap::priv::
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::operator++(&local_220);
      container = local_208;
      sVar10 = sVar10 + 1;
      cVar11 = phmap::priv::
               btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
               ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                      *)local_208);
      lVar7 = lVar7 + 0x18;
      lVar8 = lVar8 + 0x20;
    } while (local_220.position != cVar11.position || local_220.node != cVar11.node);
  }
  cVar11 = phmap::priv::
           btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
           ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                  *)container);
  sVar9 = sVar10;
  if ((local_220.node != cVar11.node) || (local_220.position != cVar11.position)) {
    do {
      do {
        sVar9 = sVar9 + 1;
        phmap::priv::
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
        ::operator++(&local_220);
        cVar11 = phmap::priv::
                 btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                 ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                        *)container);
      } while (local_220.node != cVar11.node);
    } while (local_220.position != cVar11.position);
  }
  if (sVar9 == ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    if (!bVar6) {
      bVar6 = true;
      if ((local_210 != (ostream *)0x0) &&
         ((this->matchers_).
          super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        lVar8 = 8;
        bVar4 = false;
        lVar7 = 0;
        do {
          pbVar3 = local_1e0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_1e0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar8) != 0) {
            if (bVar4) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
            }
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            bVar4 = true;
            if (pMVar5->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar5->stream_,*(char **)((long)pbVar3 + lVar8 + -8),
                         *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar8));
            }
          }
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0x20;
        } while (lVar7 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
      }
      goto LAB_001cf6a4;
    }
    if (local_210 != (ostream *)0x0) {
      cVar11 = phmap::priv::
               btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
               ::begin((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
                        *)container);
      local_200.node = cVar11.node;
      local_200.position = cVar11.position;
      if (sVar10 != 0) {
        sVar9 = sVar10;
        do {
          phmap::priv::
          btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
          ::operator++(&local_200);
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      if (pMVar5->stream_ != (ostream *)0x0) {
        std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
      }
      pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x4025d6);
      if (((ulong)local_200.node & 7) != 0) {
LAB_001cf78e:
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                      ,0xf84,
                      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                     );
      }
      PrintToString<int>((string *)local_1c8,
                         (int *)(local_200.node + (long)local_200.position * 4 + 0xc));
      if (pMVar5->stream_ != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (pMVar5->stream_,(char *)local_1c8._0_8_,local_1c8._8_8_);
      }
      MatchResultListener::operator<<(pMVar5,(char (*) [3])") ");
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
      MatcherBase<const_int_&>::DescribeNegationTo
                (&(this->matchers_).
                  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar10].super_MatcherBase<const_int_&>,
                 listener->stream_);
      poVar2 = listener->stream_;
      if ((poVar2 != (ostream *)0x0) &&
         (local_1e0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar10]._M_string_length != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,local_1e0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar10]._M_dataplus._M_p,
                   local_1e0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar10]._M_string_length);
      }
    }
  }
  else {
    bVar6 = false;
    if ((local_210 == (ostream *)0x0) || (sVar9 == 0)) goto LAB_001cf6a4;
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_phmap::btree_set<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>_>_&>
              *)local_1c8,sVar9);
    MatchResultListener::operator<<(pMVar5,(Message *)local_1c8);
    if ((_func_int **)local_1c8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
    }
  }
  bVar6 = false;
LAB_001cf6a4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  return bVar6;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool unmatched_found = false;

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        unmatched_found = true;
        // We cannot store the iterator for the unmatched element to be used
        // later, as some users use ElementsAre() with a "container" whose
        // iterator is not copy-constructible or copy-assignable.
        //
        // We cannot store a pointer to the element either, as some container's
        // iterators return a temporary.
        //
        // We cannot store the element itself either, as the element may not be
        // copyable.
        //
        // Therefore, we just remember the index of the unmatched element,
        // and use it later to print the unmatched element.
        break;
      }
    }
    // If unmatched_found is true, exam_pos is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (unmatched_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        // Find the unmatched element.
        auto unmatched_it = stl_container.begin();
        // We cannot call std::advance() on the iterator, as some users use
        // ElementsAre() with a "container" whose iterator is incompatible with
        // std::advance() (e.g. it may not have the difference_type member
        // type).
        for (size_t i = 0; i != exam_pos; ++i) {
          ++unmatched_it;
        }

        // If the array is long or the elements' print-out is large, it may be
        // hard for the user to find the mismatched element and its
        // corresponding matcher description. Therefore we print the index, the
        // value of the mismatched element, and the corresponding matcher
        // description to ease debugging.
        *listener << "whose element #" << exam_pos << " ("
                  << PrintToString(*unmatched_it) << ") ";
        matchers_[exam_pos].DescribeNegationTo(listener->stream());
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }